

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

wchar_t * el_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t **ppwVar1;
  wchar_t *pwVar2;
  el_action_t eVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  undefined1 uVar8;
  wchar_t wVar9;
  wchar_t ch;
  wchar_t nrb;
  wchar_t local_44;
  keymacro_value_t local_40;
  wchar_t local_34;
  
  pwVar6 = &local_34;
  if (nread != (wchar_t *)0x0) {
    pwVar6 = nread;
  }
  *pwVar6 = L'\0';
  el->el_read->read_errno = L'\0';
  wVar4 = el->el_flags;
  if ((wVar4 & 2U) == 0) {
    if ((wVar4 & 8U) == 0) {
      read_prepare(el);
      wVar4 = el->el_flags;
    }
    if ((wVar4 & 4U) == 0) {
switchD_0010d50b_caseD_3:
      do {
        do {
          wVar4 = el_wgetc(el,&local_44);
          wVar9 = L'\xffffffff';
          if (wVar4 != L'\x01') goto LAB_0010d614;
          if ((el->el_state).metanext != L'\0') {
            (el->el_state).metanext = L'\0';
            local_44 = local_44 | 0x80;
          }
          uVar8 = 9;
          if ((local_44 < L'Ā') &&
             (uVar8 = (el->el_map).current[(uint)(local_44 & 0xff)], uVar8 == 0x19)) {
            wVar4 = keymacro_get(el,&local_44,&local_40);
            uVar8 = local_40.cmd;
            if (wVar4 != L'\0') {
              if (wVar4 != L'\x01') {
                if (wVar4 != L'\x02') {
                  abort();
                }
                goto LAB_0010d614;
              }
              el_wpush(el,(wchar_t *)CONCAT71(local_40._1_7_,local_40.cmd));
              uVar8 = 0x19;
            }
            if (uVar8 == 0x19) goto switchD_0010d50b_caseD_3;
          }
        } while ((el->el_map).nfunc <= (ulong)(byte)uVar8);
        (el->el_state).thiscmd = uVar8;
        (el->el_state).thisch = local_44;
        if ((((el->el_map).type == L'\x01') && ((el->el_map).current == (el->el_map).key)) &&
           (pwVar7 = (el->el_chared).c_redo.pos, pwVar7 < (el->el_chared).c_redo.lim)) {
          if ((uVar8 == 0x3a) && (pwVar7 != (el->el_chared).c_redo.buf)) {
            iVar5 = iswprint(pwVar7[-1]);
            if (iVar5 != 0) {
              ppwVar1 = &(el->el_chared).c_redo.pos;
              *ppwVar1 = *ppwVar1 + -1;
              goto LAB_0010d4d9;
            }
            pwVar7 = (el->el_chared).c_redo.pos;
          }
          (el->el_chared).c_redo.pos = pwVar7 + 1;
          *pwVar7 = local_44;
        }
LAB_0010d4d9:
        eVar3 = (*(el->el_map).func[(byte)uVar8])(el,local_44);
        (el->el_state).lastcmd = uVar8;
        wVar9 = L'\xffffffff';
        switch(eVar3) {
        case '\0':
          break;
        case '\x01':
          wVar9 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer) >> 2)
          ;
          break;
        case '\x02':
          wVar9 = L'\0';
          if ((el->el_flags & L'\b') != L'\0') {
            pwVar2 = (el->el_line).lastchar;
            pwVar7 = pwVar2 + 1;
            (el->el_line).lastchar = pwVar7;
            *pwVar2 = L'\x04';
            (el->el_line).cursor = pwVar7;
            wVar9 = L'\x01';
          }
          break;
        case '\x03':
          goto switchD_0010d50b_caseD_3;
        case '\x04':
          goto switchD_0010d50b_caseD_4;
        case '\x05':
          re_refresh_cursor(el);
          break;
        default:
          terminal_beep(el);
          terminal__flush(el);
          break;
        case '\a':
          re_clear_display(el);
          ch_reset(el);
          read_clearmacros(&el->el_read->macros);
          goto switchD_0010d50b_caseD_4;
        case '\b':
          re_clear_lines(el);
          re_clear_display(el);
switchD_0010d50b_caseD_4:
          re_refresh(el);
          break;
        case '\t':
          re_refresh(el);
          terminal_beep(el);
        }
        (el->el_state).doingarg = L'\0';
        (el->el_state).argument = L'\x01';
        (el->el_chared).c_vcmd.action = L'\0';
        if (((el->el_flags & L'\b') != L'\0') || (wVar9 != L'\xffffffff')) goto LAB_0010d614;
      } while( true );
    }
    if ((wVar4 & 8U) == 0) {
      (el->el_line).lastchar = (el->el_line).buffer;
    }
    terminal__flush(el);
  }
  else {
    (el->el_line).lastchar = (el->el_line).buffer;
  }
  pwVar6 = noedit_wgets(el,pwVar6);
  return pwVar6;
LAB_0010d614:
  terminal__flush(el);
  if ((el->el_flags & L'\b') == L'\0') {
    read_finish(el);
    wVar4 = wVar9;
    if (wVar9 == L'\xffffffff') goto LAB_0010d654;
  }
  else {
    wVar4 = (wchar_t)((ulong)((long)(el->el_line).lastchar - (long)(el->el_line).buffer) >> 2);
  }
  *pwVar6 = wVar4;
  if (wVar4 != L'\0') {
    return (el->el_line).buffer;
  }
  if (wVar9 != L'\xffffffff') {
    return (wchar_t *)0x0;
  }
LAB_0010d654:
  *pwVar6 = L'\xffffffff';
  wVar4 = el->el_read->read_errno;
  if (wVar4 != L'\0') {
    pwVar6 = __errno_location();
    *pwVar6 = wVar4;
  }
  return (wchar_t *)0x0;
}

Assistant:

const wchar_t *
el_wgets(EditLine *el, int *nread)
{
	int retval;
	el_action_t cmdnum = 0;
	int num;		/* how many chars we have read at NL */
	wchar_t ch;
	int nrb;

	if (nread == NULL)
		nread = &nrb;
	*nread = 0;
	el->el_read->read_errno = 0;

	if (el->el_flags & NO_TTY) {
		el->el_line.lastchar = el->el_line.buffer;
		return noedit_wgets(el, nread);
	}

#ifdef FIONREAD
	if (el->el_tty.t_mode == EX_IO && el->el_read->macros.level < 0) {
		int chrs = 0;

		(void) ioctl(el->el_infd, FIONREAD, &chrs);
		if (chrs == 0) {
			if (tty_rawmode(el) < 0) {
				errno = 0;
				*nread = 0;
				return NULL;
			}
		}
	}
#endif /* FIONREAD */

	if ((el->el_flags & UNBUFFERED) == 0)
		read_prepare(el);

	if (el->el_flags & EDIT_DISABLED) {
		if ((el->el_flags & UNBUFFERED) == 0)
			el->el_line.lastchar = el->el_line.buffer;
		terminal__flush(el);
		return noedit_wgets(el, nread);
	}

	for (num = -1; num == -1;) {  /* while still editing this line */
		/* if EOF or error */
		if (read_getcmd(el, &cmdnum, &ch) == -1)
			break;
		if ((size_t)cmdnum >= el->el_map.nfunc) /* BUG CHECK command */
			continue;	/* try again */
		/* now do the real command */
		/* vi redo needs these way down the levels... */
		el->el_state.thiscmd = cmdnum;
		el->el_state.thisch = ch;
		if (el->el_map.type == MAP_VI &&
		    el->el_map.current == el->el_map.key &&
		    el->el_chared.c_redo.pos < el->el_chared.c_redo.lim) {
			if (cmdnum == VI_DELETE_PREV_CHAR &&
			    el->el_chared.c_redo.pos != el->el_chared.c_redo.buf
			    && iswprint(el->el_chared.c_redo.pos[-1]))
				el->el_chared.c_redo.pos--;
			else
				*el->el_chared.c_redo.pos++ = ch;
		}
		retval = (*el->el_map.func[cmdnum]) (el, ch);

		/* save the last command here */
		el->el_state.lastcmd = cmdnum;

		/* use any return value */
		switch (retval) {
		case CC_CURSOR:
			re_refresh_cursor(el);
			break;

		case CC_REDISPLAY:
			re_clear_lines(el);
			re_clear_display(el);
			/* FALLTHROUGH */

		case CC_REFRESH:
			re_refresh(el);
			break;

		case CC_REFRESH_BEEP:
			re_refresh(el);
			terminal_beep(el);
			break;

		case CC_NORM:	/* normal char */
			break;

		case CC_ARGHACK:	/* Suggested by Rich Salz */
			/* <rsalz@pineapple.bbn.com> */
			continue;	/* keep going... */

		case CC_EOF:	/* end of file typed */
			if ((el->el_flags & UNBUFFERED) == 0)
				num = 0;
			else if (num == -1) {
				*el->el_line.lastchar++ = CONTROL('d');
				el->el_line.cursor = el->el_line.lastchar;
				num = 1;
			}
			break;

		case CC_NEWLINE:	/* normal end of line */
			num = (int)(el->el_line.lastchar - el->el_line.buffer);
			break;

		case CC_FATAL:	/* fatal error, reset to known state */
			/* put (real) cursor in a known place */
			re_clear_display(el);	/* reset the display stuff */
			ch_reset(el);	/* reset the input pointers */
			read_clearmacros(&el->el_read->macros);
			re_refresh(el); /* print the prompt again */
			break;

		case CC_ERROR:
		default:	/* functions we don't know about */
			terminal_beep(el);
			terminal__flush(el);
			break;
		}
		el->el_state.argument = 1;
		el->el_state.doingarg = 0;
		el->el_chared.c_vcmd.action = NOP;
		if (el->el_flags & UNBUFFERED)
			break;
	}

	terminal__flush(el);		/* flush any buffered output */
	/* make sure the tty is set up correctly */
	if ((el->el_flags & UNBUFFERED) == 0) {
		read_finish(el);
		*nread = num != -1 ? num : 0;
	} else
		*nread = (int)(el->el_line.lastchar - el->el_line.buffer);

	if (*nread == 0) {
		if (num == -1) {
			*nread = -1;
			if (el->el_read->read_errno)
				errno = el->el_read->read_errno;
		}
		return NULL;
	} else
		return el->el_line.buffer;
}